

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

Mat * __thiscall ncnn::Mat::shape(Mat *__return_storage_ptr__,Mat *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar1 = this->dims;
  if (iVar1 == 3) {
    Mat(__return_storage_ptr__,this->w,this->h,this->elempack * this->c,(void *)0x0,4,
        (Allocator *)0x0);
  }
  else if (iVar1 == 2) {
    iVar1 = this->w;
    iVar2 = this->elempack * this->h;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->elempack = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 2;
    __return_storage_ptr__->w = iVar1;
    __return_storage_ptr__->h = iVar2;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = (long)(iVar2 * iVar1);
  }
  else if (iVar1 == 1) {
    sVar3 = (long)this->elempack * (long)this->w;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->elempack = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    __return_storage_ptr__->w = (int)sVar3;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = sVar3;
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::shape() const
{
    if (dims == 1)
        return Mat(w * elempack, (void*)0);
    if (dims == 2)
        return Mat(w, h * elempack, (void*)0);
    if (dims == 3)
        return Mat(w, h, c * elempack, (void*)0);

    return Mat();
}